

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_io.cpp
# Opt level: O0

uint32_t findConverter(char *alias,UBool *containsOption,UErrorCode *pErrorCode)

{
  uint uVar1;
  char cVar2;
  uint uVar3;
  size_t sVar4;
  bool bVar5;
  byte local_8a;
  char local_88 [7];
  UBool containsCnvOptionInfo;
  char strippedName [60];
  int local_3c;
  int isUnnormalized;
  int result;
  uint32_t lastMid;
  uint32_t limit;
  uint32_t start;
  uint32_t mid;
  UErrorCode *pErrorCode_local;
  UBool *containsOption_local;
  char *alias_local;
  
  bVar5 = (gMainTable.optionTable)->stringNormalizationType != 0;
  containsOption_local = alias;
  if (bVar5) {
    sVar4 = strlen(alias);
    if (0x3b < sVar4) {
      *pErrorCode = U_BUFFER_OVERFLOW_ERROR;
      return 0xffffffff;
    }
    ucnv_io_stripASCIIForCompare_63(local_88,alias);
    containsOption_local = local_88;
  }
  lastMid = 0;
  result = gMainTable.untaggedConvArraySize;
  isUnnormalized = -1;
  uVar1 = result;
  do {
    result = uVar1;
    uVar3 = lastMid + result >> 1;
    if (isUnnormalized == uVar3) {
      return 0xffffffff;
    }
    if (bVar5) {
      local_3c = strcmp(containsOption_local,
                        (char *)(gMainTable.normalizedStringTable +
                                (int)(uint)gMainTable.aliasList[uVar3]));
    }
    else {
      local_3c = ucnv_compareNames_63
                           (containsOption_local,
                            (char *)(gMainTable.stringTable + (int)(uint)gMainTable.aliasList[uVar3]
                                    ));
    }
    isUnnormalized = uVar3;
    uVar1 = uVar3;
  } while ((local_3c < 0) || (uVar1 = result, lastMid = uVar3, 0 < local_3c));
  if ((gMainTable.untaggedConvArray[uVar3] & 0x8000) != 0) {
    *pErrorCode = U_AMBIGUOUS_ALIAS_WARNING;
  }
  if (containsOption != (UBool *)0x0) {
    cVar2 = (char)(gMainTable.optionTable)->containsCnvOptionInfo;
    if ((cVar2 == '\0') || (local_8a = 1, (gMainTable.untaggedConvArray[uVar3] & 0x4000) == 0)) {
      local_8a = cVar2 != '\0' ^ 0xff;
    }
    *containsOption = local_8a & 1;
  }
  return gMainTable.untaggedConvArray[uVar3] & 0xfff;
}

Assistant:

static inline uint32_t
findConverter(const char *alias, UBool *containsOption, UErrorCode *pErrorCode) {
    uint32_t mid, start, limit;
    uint32_t lastMid;
    int result;
    int isUnnormalized = (gMainTable.optionTable->stringNormalizationType == UCNV_IO_UNNORMALIZED);
    char strippedName[UCNV_MAX_CONVERTER_NAME_LENGTH];

    if (!isUnnormalized) {
        if (uprv_strlen(alias) >= UCNV_MAX_CONVERTER_NAME_LENGTH) {
            *pErrorCode = U_BUFFER_OVERFLOW_ERROR;
            return UINT32_MAX;
        }

        /* Lower case and remove ignoreable characters. */
        ucnv_io_stripForCompare(strippedName, alias);
        alias = strippedName;
    }

    /* do a binary search for the alias */
    start = 0;
    limit = gMainTable.untaggedConvArraySize;
    mid = limit;
    lastMid = UINT32_MAX;

    for (;;) {
        mid = (uint32_t)((start + limit) / 2);
        if (lastMid == mid) {   /* Have we moved? */
            break;  /* We haven't moved, and it wasn't found. */
        }
        lastMid = mid;
        if (isUnnormalized) {
            result = ucnv_compareNames(alias, GET_STRING(gMainTable.aliasList[mid]));
        }
        else {
            result = uprv_strcmp(alias, GET_NORMALIZED_STRING(gMainTable.aliasList[mid]));
        }

        if (result < 0) {
            limit = mid;
        } else if (result > 0) {
            start = mid;
        } else {
            /* Since the gencnval tool folds duplicates into one entry,
             * this alias in gAliasList is unique, but different standards
             * may map an alias to different converters.
             */
            if (gMainTable.untaggedConvArray[mid] & UCNV_AMBIGUOUS_ALIAS_MAP_BIT) {
                *pErrorCode = U_AMBIGUOUS_ALIAS_WARNING;
            }
            /* State whether the canonical converter name contains an option.
            This information is contained in this list in order to maintain backward & forward compatibility. */
            if (containsOption) {
                UBool containsCnvOptionInfo = (UBool)gMainTable.optionTable->containsCnvOptionInfo;
                *containsOption = (UBool)((containsCnvOptionInfo
                    && ((gMainTable.untaggedConvArray[mid] & UCNV_CONTAINS_OPTION_BIT) != 0))
                    || !containsCnvOptionInfo);
            }
            return gMainTable.untaggedConvArray[mid] & UCNV_CONVERTER_INDEX_MASK;
        }
    }

    return UINT32_MAX;
}